

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main() {
  State *stateA = new ConcreteStateA;
  State *stateB = new ConcreteStateB;

  Context *context = new Context;

  context->setState(stateA);
  int value = context->request();
  assert(value == 10);

  context->setState(stateB);
  value = context->request();
  assert(value == 100);
}